

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereInfoFree(sqlite3 *db,WhereInfo *pWInfo)

{
  long lVar1;
  WhereClause *in_RSI;
  WhereLoop *p;
  WhereLevel *pLevel;
  int i;
  WhereOrInfo *in_stack_ffffffffffffffd8;
  sqlite3 *in_stack_ffffffffffffffe0;
  int local_14;
  
  for (local_14 = 0; local_14 < (int)(uint)*(byte *)((long)&in_RSI->aStatic[0].iParent + 2);
      local_14 = local_14 + 1) {
    in_stack_ffffffffffffffe0 = (sqlite3 *)((long)in_RSI[1].aStatic + (long)local_14 * 0x58 + 0x148)
    ;
    lVar1._0_4_ = in_stack_ffffffffffffffe0->nSchemaLock;
    lVar1._4_4_ = in_stack_ffffffffffffffe0->openFlags;
    if ((lVar1 != 0) &&
       ((*(uint *)(*(long *)&in_stack_ffffffffffffffe0->nSchemaLock + 0x28) & 0x800) != 0)) {
      sqlite3DbFree(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
  }
  sqlite3WhereClauseClear(in_RSI);
  while (in_RSI->aStatic[0].u.pOrInfo != (WhereOrInfo *)0x0) {
    in_stack_ffffffffffffffd8 = in_RSI->aStatic[0].u.pOrInfo;
    in_RSI->aStatic[0].u =
         *(anon_union_8_3_737c4e49_for_u *)&(in_stack_ffffffffffffffd8->wc).aStatic[0].iParent;
    whereLoopDelete(in_stack_ffffffffffffffe0,(WhereLoop *)in_stack_ffffffffffffffd8);
  }
  sqlite3DbFreeNN(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void whereInfoFree(sqlite3 *db, WhereInfo *pWInfo){
  int i;
  assert( pWInfo!=0 );
  for(i=0; i<pWInfo->nLevel; i++){
    WhereLevel *pLevel = &pWInfo->a[i];
    if( pLevel->pWLoop && (pLevel->pWLoop->wsFlags & WHERE_IN_ABLE) ){
      sqlite3DbFree(db, pLevel->u.in.aInLoop);
    }
  }
  sqlite3WhereClauseClear(&pWInfo->sWC);
  while( pWInfo->pLoops ){
    WhereLoop *p = pWInfo->pLoops;
    pWInfo->pLoops = p->pNextLoop;
    whereLoopDelete(db, p);
  }
  sqlite3DbFreeNN(db, pWInfo);
}